

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  ExpectationBase *pEVar1;
  element_type *peVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  allocator_type local_51;
  ExpectationBase *next;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  
  next = this;
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector(&expectations,1,&next,&local_51);
  while( true ) {
    ppEVar4 = expectations.
              super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar3 = expectations.
              super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (expectations.
        super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        expectations.
        super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    pEVar1 = expectations.
             super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    expectations.
    super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         expectations.
         super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    for (p_Var6 = (pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.
                  super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 !=
        &(pEVar1->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      next = *(ExpectationBase **)(p_Var6 + 1);
      peVar2 = (next->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar5 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)(uint)next->call_count_);
      if ((char)iVar5 == '\0') goto LAB_0018fe82;
      std::
      vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
      ::push_back(&expectations,&next);
    }
  }
LAB_0018fe82:
  std::
  _Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::~_Vector_base(&expectations.
                   super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                 );
  return ppEVar3 == ppEVar4;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}